

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O0

void __thiscall sznet::net::KcpWithTcpServer::setThreadNum(KcpWithTcpServer *this,int numThreads)

{
  size_type sVar1;
  element_type *this_00;
  int numThreads_local;
  KcpWithTcpServer *this_local;
  
  if (numThreads < 0) {
    __assert_fail("0 <= numThreads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                  ,0x2d,"void sznet::net::KcpWithTcpServer::setThreadNum(int)");
  }
  sVar1 = std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::size
                    (&this->m_udpListenAddrs);
  if (sVar1 == (long)numThreads) {
    this_00 = std::
              __shared_ptr_access<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_threadPool);
    KcpTcpEventLoopThreadPool::setThreadNum(this_00,numThreads);
    return;
  }
  __assert_fail("m_udpListenAddrs.size() == numThreads",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                ,0x2e,"void sznet::net::KcpWithTcpServer::setThreadNum(int)");
}

Assistant:

void KcpWithTcpServer::setThreadNum(int numThreads)
{
	assert(0 <= numThreads);
	assert(m_udpListenAddrs.size() == numThreads);
	m_threadPool->setThreadNum(numThreads);
}